

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>(WasmBytecodeGenerator *this)

{
  ArenaAllocator *this_00;
  TypedRegisterAllocator *pTVar1;
  Type TVar2;
  IWasmByteCodeWriter *pIVar3;
  code *pcVar4;
  bool bVar5;
  ArgSlot AVar6;
  uint16 uVar7;
  Local LVar8;
  undefined4 uVar9;
  RegSlot RVar10;
  RegSlot tmpReg;
  uint uVar11;
  uint32 uVar12;
  EmitInfoBase EVar13;
  AsmJsRetType AVar14;
  undefined4 *puVar15;
  WasmBinaryReader *pWVar16;
  WasmSignature *this_01;
  EmitInfo *pEVar17;
  EmitInfo EVar18;
  RegisterSpace *pRVar19;
  WasmRegisterSpace *pWVar20;
  EmitInfo EVar21;
  WasmCompilationException *this_02;
  byte bVar22;
  undefined8 in_RCX;
  ushort uVar23;
  ulong uVar24;
  ulong uVar25;
  WasmType WVar26;
  WasmBytecodeGenerator *pWVar27;
  ulong uVar28;
  uint32 i_1;
  uint32 i;
  uint uVar29;
  PolymorphicEmitInfo PVar30;
  undefined1 local_a0 [8];
  PolymorphicEmitInfo retInfo;
  EmitInfo local_80;
  EmitInfo *local_78;
  ulong local_70;
  uint local_64;
  undefined8 local_60;
  undefined4 *local_58;
  WasmBytecodeGenerator *local_50;
  uint local_44;
  ulong local_40;
  ArgSlot local_34;
  anon_class_1_0_00000001 local_31 [5];
  ArgSlot args;
  anon_class_1_0_00000001 argOverflow;
  
  pWVar16 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar16 == (WasmBinaryReader *)0x0) {
    pWVar16 = (this->m_module->m_reader).ptr;
  }
  TVar2 = (pWVar16->super_WasmReaderBase).m_currentNode.field_1.call.funcType;
  if (TVar2 == Function) {
LAB_00d731be:
    local_40 = local_40 & 0xffffffff00000000;
  }
  else {
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)in_RCX >> 8),1));
    if (TVar2 != Import) {
      if (TVar2 != ImportThunk) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar15 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x449,
                           "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                           ,
                           "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                          );
        if (!bVar5) goto LAB_00d739a9;
        *puVar15 = 0;
      }
      goto LAB_00d731be;
    }
  }
  local_80 = PopEvalStack(this,FirstLocalType,L"Indirect call index must be int type");
  pWVar16 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar16 == (WasmBinaryReader *)0x0) {
    pWVar16 = (this->m_module->m_reader).ptr;
  }
  this_01 = Js::WebAssemblyModule::GetSignature
                      (this->m_module,
                       (pWVar16->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  if ((char)local_40 == '\0') {
    AVar6 = WasmSignature::GetParamsSize(this_01);
    uVar23 = 0x1c;
  }
  else {
    AVar6 = WasmSignature::GetParamCount(this_01);
    if (0x1fff < AVar6) {
      EmitCall<(Wasm::WasmOp)17>::anon_class_1_0_00000001::operator()(local_31);
    }
    AVar6 = AVar6 << 3;
    uVar23 = 0x11;
  }
  uVar7 = UInt16Math::
          Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                    (AVar6,8,local_31);
  if ((uVar7 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar5) {
LAB_00d739a9:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar15 = 0;
    this_02 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_02,L"Internal Error");
    goto LAB_00d73925;
  }
  local_64 = (uint)uVar7;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)uVar23,(ulong)uVar7,0);
  AVar6 = WasmSignature::GetParamCount(this_01);
  this_00 = &this->m_alloc;
  uVar25 = (ulong)AVar6;
  pEVar17 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::EmitInfo,false>
                      ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,uVar25);
  local_78 = pEVar17;
  local_70 = uVar25;
  for (; 0 < (long)uVar25; uVar25 = uVar25 - 1) {
    LVar8 = WasmSignature::GetParam(this_01,(short)uVar25 - 1);
    EVar18 = PopEvalStack(this,LVar8,L"Call argument does not match formal type");
    local_78[uVar25 - 1] = EVar18;
  }
  local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_60 = (TypedRegisterAllocator *)
             (CONCAT44(local_60._4_4_,(undefined4)local_40) & 0xffffffff000000ff ^ 0x145);
  bVar22 = (byte)local_40;
  bVar5 = bVar22 != 0;
  retInfo.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)0x21;
  if (bVar5) {
    retInfo.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)0x15;
  }
  retInfo.field_1.singleInfo.type = 0x20;
  if (bVar5) {
    retInfo.field_1.singleInfo.type = 0x14;
  }
  local_44 = 0x22;
  if (bVar5) {
    local_44 = 0x16;
  }
  uVar24 = 0;
  uVar25 = 1;
  local_50 = this;
LAB_00d7334e:
  pWVar27 = local_50;
  if (local_70 == uVar24) goto LAB_00d734c0;
  WVar26 = local_78[uVar24].type;
  if (7 < WVar26 - FirstLocalType) {
switchD_00d7338e_caseD_6:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_02 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_02,L"Unknown argument type %u",(ulong)WVar26);
    goto LAB_00d73925;
  }
  uVar29 = local_78[uVar24].super_EmitInfoBase.location;
  uVar28 = (ulong)local_44;
  switch(WVar26) {
  case FirstLocalType:
    uVar9 = retInfo.field_1.singleInfo.type;
    break;
  case I64:
    uVar9 = retInfo.field_1.singleInfo.super_EmitInfoBase.location;
    break;
  case F32:
    goto switchD_00d7338e_caseD_3;
  case F64:
    uVar9 = (uint)(bVar22 ^ 1) * 8 + 0x17;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    uVar9 = (uint)local_60;
    break;
  default:
    goto switchD_00d7338e_caseD_6;
  case Any:
    uVar28 = 0x14;
    if (local_50->isUnreachable != false) goto switchD_00d7338e_caseD_3;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_58 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4a6,"(IsUnreachable())","IsUnreachable()");
    if (!bVar5) goto LAB_00d739a9;
    *local_58 = 0;
    if ((local_50->isUnreachable & 1U) == 0) goto switchD_00d7338e_caseD_6;
    goto switchD_00d7338e_caseD_3;
  }
  uVar28 = (ulong)(uint)uVar9;
switchD_00d7338e_caseD_3:
  (*local_50->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (local_50->m_writer,uVar28 & 0xffff,uVar25,(ulong)uVar29);
  uVar29 = 1;
  if ((char)local_40 == '\0') {
    AVar6 = WasmSignature::GetParamSize(this_01,(ArgSlot)uVar24);
    if ((AVar6 & 7) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = local_58;
      *local_58 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x4bc,"(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                         "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
      if (!bVar5) goto LAB_00d739a9;
      *puVar15 = 0;
    }
    uVar29 = (uint)(AVar6 >> 3);
  }
  uVar25 = (ulong)((int)uVar25 + uVar29);
  uVar24 = uVar24 + 1;
  goto LAB_00d7334e;
LAB_00d734c0:
  pTVar1 = &local_50->mTypedRegisterAllocator;
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(pTVar1,INT64);
  RVar10 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(pTVar1,INT64);
  tmpReg = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  pIVar3 = local_50->m_writer;
  uVar11 = Js::WebAssemblyModule::GetTableEnvironmentOffset(pWVar27->m_module);
  pWVar27 = local_50;
  (*pIVar3->_vptr_IWasmByteCodeWriter[0x18])(pIVar3,0x4d,(ulong)tmpReg,1,(ulong)uVar11);
  (*pWVar27->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (pWVar27->m_writer,0x58,(ulong)RVar10,(ulong)tmpReg,(ulong)local_80 & 0xffffffff);
  local_60 = pTVar1;
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(pTVar1,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,tmpReg);
  pIVar3 = pWVar27->m_writer;
  uVar12 = WasmSignature::GetSignatureId(this_01);
  local_44 = RVar10;
  (*pIVar3->_vptr_IWasmByteCodeWriter[9])(pIVar3,0x59,(ulong)RVar10,(ulong)uVar12);
  local_a0._0_4_ = 0;
  retInfo.count = 0;
  retInfo._4_4_ = 0;
  PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)local_a0,this_01->m_resultsCount,this_00);
  for (uVar29 = 0; uVar29 < this_01->m_resultsCount; uVar29 = uVar29 + 1) {
    LVar8 = WasmSignature::GetResult(this_01,uVar29);
    PolymorphicEmitInfo::SetInfo
              ((PolymorphicEmitInfo *)local_a0,(EmitInfo)(((ulong)LVar8 << 0x20) + 0xffffffff),
               uVar29);
  }
  if ((char)local_40 == '\0') {
    pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(local_60,INT64);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,local_44);
    ReleaseLocation(pWVar27,&local_80);
    for (uVar25 = (ulong)(uint)((int)local_70 * 8); uVar25 != 0; uVar25 = uVar25 - 8) {
      ReleaseLocation(pWVar27,(EmitInfo *)((long)&pEVar17[-1].super_EmitInfoBase.location + uVar25))
      ;
    }
    for (uVar29 = 0; uVar29 < this_01->m_resultsCount; uVar29 = uVar29 + 1) {
      LVar8 = WasmSignature::GetResult(this_01,uVar29);
      pWVar20 = GetRegisterSpace(local_50,LVar8);
      EVar13.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar20);
      EVar18.type = LVar8;
      EVar18.super_EmitInfoBase.location = EVar13.location;
      PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_a0,EVar18,uVar29);
    }
    if (local_a0._0_4_ == 0) {
      WVar26 = Void;
      EVar21.super_EmitInfoBase.location = 0xffffffff;
      EVar21.type = ~Void;
    }
    else {
      EVar21 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_a0,0);
      WVar26 = EVar21.type;
    }
    pWVar27 = local_50;
    uVar29 = local_64 >> 3;
    local_34 = (ArgSlot)uVar29;
    pIVar3 = local_50->m_writer;
    AVar14 = WasmToAsmJs::GetAsmJsReturnType(WVar26);
    (*pIVar3->_vptr_IWasmByteCodeWriter[0x20])
              (pIVar3,0x1d,(ulong)EVar21 & 0xffffffff,(ulong)local_44,(ulong)uVar29,
               (ulong)AVar14.which_,0xffff);
    goto LAB_00d738b6;
  }
  local_34 = WasmSignature::GetParamCount(this_01);
  UInt16Math::Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
            (&local_34,local_31);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(local_60,INT64);
  RVar10 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  uVar29 = this_01->m_resultsCount;
  if (1 < uVar29) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = local_58;
    *local_58 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                       "Multiple results from function imports not supported");
    if (!bVar5) goto LAB_00d739a9;
    *puVar15 = 0;
    uVar29 = this_01->m_resultsCount;
  }
  if (uVar29 == 0) {
    local_40 = 0;
  }
  else {
    LVar8 = WasmSignature::GetResult(this_01,0);
    local_40 = (ulong)LVar8;
  }
  pIVar3 = pWVar27->m_writer;
  uVar25 = (ulong)local_34;
  AVar14 = WasmToAsmJs::GetAsmJsReturnType((WasmType)local_40);
  uVar29 = local_44;
  pWVar27 = local_50;
  (*pIVar3->_vptr_IWasmByteCodeWriter[0x20])
            (pIVar3,0x12,(ulong)RVar10,(ulong)local_44,uVar25,(ulong)AVar14.which_,0xffff);
  pTVar1 = local_60;
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(local_60,INT64);
  local_58 = (undefined4 *)CONCAT44(local_58._4_4_,RVar10);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,RVar10);
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(pTVar1,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar19,uVar29);
  ReleaseLocation(pWVar27,&local_80);
  for (uVar25 = (ulong)(uint)((int)local_70 * 8); uVar24 = local_40, puVar15 = local_58, uVar25 != 0
      ; uVar25 = uVar25 - 8) {
    ReleaseLocation(pWVar27,(EmitInfo *)((long)&pEVar17[-1].super_EmitInfoBase.location + uVar25));
  }
  if (this_01->m_resultsCount == 0) goto LAB_00d738b6;
  switch((WasmType)local_40) {
  case FirstLocalType:
    uVar23 = 0x18;
    break;
  case I64:
    uVar23 = 0x1b;
    break;
  case F32:
    uVar23 = 0x19;
    break;
  case F64:
    uVar23 = 0x1a;
    break;
  case V128:
    this_02 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_02,L"Return type: v128 not supported in import calls");
    goto LAB_00d73925;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_02 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_02,L"Unknown call return type %u",uVar24 & 0xffffffff);
LAB_00d73925:
    __cxa_throw(this_02,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar20 = GetRegisterSpace(pWVar27,(WasmType)local_40);
  RVar10 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar20);
  PolymorphicEmitInfo::SetInfo
            ((PolymorphicEmitInfo *)local_a0,(EmitInfo)((ulong)RVar10 | uVar24 << 0x20),0);
  (*pWVar27->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (pWVar27->m_writer,(ulong)uVar23,(ulong)RVar10,(ulong)puVar15 & 0xffffffff);
LAB_00d738b6:
  Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>(this_00,local_70,local_78);
  if (pWVar27->m_maxArgOutDepth <= (uint)local_34) {
    pWVar27->m_maxArgOutDepth = local_34 + 1;
  }
  PVar30._4_4_ = 0;
  PVar30.count = local_a0._0_4_;
  PVar30.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
  return PVar30;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}